

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraCodeBlocksGenerator::CreateNewProjectFile
          (cmExtraCodeBlocksGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *filename)

{
  cmMakefile *mf;
  cmGlobalGenerator *pcVar1;
  pointer pcVar2;
  size_type sVar3;
  cmMakefile *pcVar4;
  pointer ppcVar5;
  cmLocalGenerator *pcVar6;
  pointer puVar7;
  cmGeneratorTarget *pcVar8;
  cmake *pcVar9;
  cmSourceFile *this_00;
  cmMakefile *this_01;
  pointer pbVar10;
  _Base_ptr p_Var11;
  pointer pbVar12;
  pointer ppcVar13;
  bool bVar14;
  __type _Var15;
  bool bVar16;
  TargetType TVar17;
  string *psVar18;
  long lVar19;
  _Rb_tree_node_base *p_Var20;
  string *psVar21;
  pointer ppcVar22;
  string *psVar23;
  string *__rhs;
  vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *this_02;
  iterator iVar24;
  mapped_type *__x;
  mapped_type *this_03;
  _Base_ptr p_Var25;
  _Base_ptr p_Var26;
  pointer ppcVar27;
  pointer puVar28;
  pointer filename_00;
  pointer args;
  string_view ext;
  string_view prefix;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  all_files_map_t allFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  listFiles;
  string lang;
  string compiler;
  cmXMLWriter xml;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string fastTarget;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cFiles;
  string local_320;
  Tree tree;
  cmGeneratedFileStream fout;
  
  mf = (*(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
         super__Vector_impl_data._M_start)->Makefile;
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,filename,false,None);
  if (((&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    tree.path._M_dataplus._M_p = (pointer)&tree.path.field_2;
    tree.path._M_string_length = 0;
    tree.path.field_2._M_local_buf[0] = '\0';
    tree.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    tree.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    tree.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    tree.files._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &tree.files._M_t._M_impl.super__Rb_tree_header._M_header;
    tree.files._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    tree.files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    tree.files._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    tree.files._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         tree.files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var20 = (pcVar1->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var20 != &(pcVar1->ProjectMap)._M_t._M_impl.super__Rb_tree_header;
        p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20)) {
      listFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      listFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      listFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      p_Var26 = p_Var20[2]._M_parent;
      for (p_Var25 = *(_Base_ptr *)(p_Var20 + 2);
          pbVar12 = listFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
          psVar21 = listFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, p_Var25 != p_Var26;
          p_Var25 = (_Base_ptr)&p_Var25->_M_parent) {
        ::cm::
        append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                  (&listFiles,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(*(long *)(*(long *)p_Var25 + 0x70) + 0x1e8));
      }
      for (; psVar21 != pbVar12; psVar21 = psVar21 + 1) {
        pcVar2 = (psVar21->_M_dataplus)._M_p;
        sVar3 = psVar21->_M_string_length;
        psVar18 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
        prefix._M_str = (psVar18->_M_dataplus)._M_p;
        prefix._M_len = psVar18->_M_string_length;
        str._M_str = pcVar2;
        str._M_len = sVar3;
        bVar14 = cmHasPrefix(str,prefix);
        if (!bVar14) {
          psVar18 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_
                              ((cmLocalGenerator *)**(undefined8 **)(p_Var20 + 2));
          cmSystemTools::RelativePath((string *)&xml,psVar18,psVar21);
          compiler._M_dataplus._M_p = (pointer)0x0;
          compiler._M_string_length = 0;
          compiler.field_2._M_allocated_capacity = 0;
          cmsys::SystemTools::SplitPath
                    ((string *)&xml,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&compiler,false);
          std::__cxx11::string::string
                    ((string *)&allFiles,(string *)(compiler._M_string_length - 0x20));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&compiler,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (compiler._M_string_length - 0x20),(const_iterator)compiler._M_string_length);
          pcVar4 = *(cmMakefile **)(**(long **)(p_Var20 + 2) + 0x70);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&lang,"CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES",
                     (allocator<char> *)&fastTarget);
          bVar14 = cmMakefile::IsOn(pcVar4,&lang);
          std::__cxx11::string::~string((string *)&lang);
          if ((compiler._M_dataplus._M_p != (pointer)compiler._M_string_length) &&
             (((!bVar14 ||
               (lVar19 = std::__cxx11::string::find((char *)&xml,0x5a5197), lVar19 == -1)) &&
              (lVar19 = std::__cxx11::string::find((char *)&xml,0x569faf), lVar19 == -1)))) {
            Tree::InsertPath(&tree,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&compiler,1,(string *)&allFiles);
          }
          std::__cxx11::string::~string((string *)&allFiles);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&compiler);
          std::__cxx11::string::~string((string *)&xml);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&listFiles);
    }
    GetCBCompilerId_abi_cxx11_(&compiler,this,mf);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&xml,"CMAKE_MAKE_PROGRAM",(allocator<char> *)&allFiles);
    psVar21 = cmMakefile::GetRequiredDefinition(mf,(string *)&xml);
    std::__cxx11::string::~string((string *)&xml);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&xml,"CMAKE_CODEBLOCKS_MAKE_ARGUMENTS",(allocator<char> *)&allFiles);
    psVar18 = cmMakefile::GetSafeDefinition(mf,(string *)&xml);
    std::__cxx11::string::~string((string *)&xml);
    cmXMLWriter::cmXMLWriter(&xml,(ostream *)&fout,0);
    cmXMLWriter::StartDocument(&xml,"UTF-8");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&allFiles,"CodeBlocks_project_file",(allocator<char> *)&lang);
    cmXMLWriter::StartElement(&xml,(string *)&allFiles);
    std::__cxx11::string::~string((string *)&allFiles);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&allFiles,"FileVersion",(allocator<char> *)&lang);
    cmXMLWriter::StartElement(&xml,(string *)&allFiles);
    std::__cxx11::string::~string((string *)&allFiles);
    allFiles._M_t._M_impl._0_4_ = 1;
    cmXMLWriter::Attribute<int>(&xml,"major",(int *)&allFiles);
    allFiles._M_t._M_impl._0_4_ = 6;
    cmXMLWriter::Attribute<int>(&xml,"minor",(int *)&allFiles);
    cmXMLWriter::EndElement(&xml);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&allFiles,"Project",(allocator<char> *)&lang);
    cmXMLWriter::StartElement(&xml,(string *)&allFiles);
    std::__cxx11::string::~string((string *)&allFiles);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&allFiles,"Option",(allocator<char> *)&lang);
    cmXMLWriter::StartElement(&xml,(string *)&allFiles);
    std::__cxx11::string::~string((string *)&allFiles);
    cmLocalGenerator::GetProjectName_abi_cxx11_
              ((string *)&allFiles,
               *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                _M_impl.super__Vector_impl_data._M_start);
    cmXMLWriter::Attribute<std::__cxx11::string>
              (&xml,"title",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&allFiles);
    std::__cxx11::string::~string((string *)&allFiles);
    cmXMLWriter::EndElement(&xml);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&allFiles,"Option",(allocator<char> *)&lang);
    cmXMLWriter::StartElement(&xml,(string *)&allFiles);
    std::__cxx11::string::~string((string *)&allFiles);
    allFiles._M_t._M_impl._0_4_ = 1;
    cmXMLWriter::Attribute<int>(&xml,"makefile_is_custom",(int *)&allFiles);
    cmXMLWriter::EndElement(&xml);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&allFiles,"Option",(allocator<char> *)&lang);
    cmXMLWriter::StartElement(&xml,(string *)&allFiles);
    std::__cxx11::string::~string((string *)&allFiles);
    cmXMLWriter::Attribute<std::__cxx11::string>(&xml,"compiler",&compiler);
    cmXMLWriter::EndElement(&xml);
    Tree::BuildVirtualFolder(&tree,&xml);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&allFiles,"Build",(allocator<char> *)&lang);
    cmXMLWriter::StartElement(&xml,(string *)&allFiles);
    std::__cxx11::string::~string((string *)&allFiles);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&allFiles,"all",(allocator<char> *)&lang);
    AppendTarget(this,&xml,(string *)&allFiles,(cmGeneratorTarget *)0x0,psVar21,
                 *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start,&compiler,psVar18);
    std::__cxx11::string::~string((string *)&allFiles);
    ppcVar5 = (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar22 = (lgs->
                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                    _M_impl.super__Vector_impl_data._M_start; ppcVar22 != ppcVar5;
        ppcVar22 = ppcVar22 + 1) {
      pcVar6 = *ppcVar22;
      puVar7 = (pcVar6->GeneratorTargets).
               super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar28 = (pcVar6->GeneratorTargets).
                     super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar28 != puVar7;
          puVar28 = puVar28 + 1) {
        psVar23 = cmGeneratorTarget::GetName_abi_cxx11_
                            ((puVar28->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                             .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
        std::__cxx11::string::string((string *)&listFiles,(string *)psVar23);
        TVar17 = cmGeneratorTarget::GetType
                           ((puVar28->_M_t).
                            super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                            .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
        if (TVar17 < UTILITY) {
          pcVar8 = (puVar28->_M_t).
                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                   .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
          AppendTarget(this,&xml,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &listFiles,pcVar8,psVar21,pcVar6,&compiler,psVar18);
          allFiles._M_t._M_impl._0_8_ =
               listFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          allFiles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               listFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          lang._M_dataplus._M_p = (pointer)0x5;
          lang._M_string_length = (long)"preinstall/fast" + 10;
          cmStrCat<>(&fastTarget,(cmAlphaNum *)&allFiles,(cmAlphaNum *)&lang);
          AppendTarget(this,&xml,&fastTarget,pcVar8,psVar21,pcVar6,&compiler,psVar18);
          std::__cxx11::string::~string((string *)&fastTarget);
        }
        else if (TVar17 == UTILITY) {
          str_00._M_str =
               (char *)listFiles.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          str_00._M_len =
               (size_t)listFiles.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          bVar14 = cmHasLiteralPrefix<8ul>(str_00,(char (*) [8])"Nightly");
          if ((((!bVar14) ||
               (bVar14 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&listFiles,"Nightly"), !bVar14)) &&
              ((str_01._M_str =
                     (char *)listFiles.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
               str_01._M_len =
                    (size_t)listFiles.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
               bVar14 = cmHasLiteralPrefix<11ul>(str_01,(char (*) [11])"Continuous"), !bVar14 ||
               (bVar14 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&listFiles,"Continuous"), !bVar14)))) &&
             ((str_02._M_str =
                    (char *)listFiles.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
              str_02._M_len =
                   (size_t)listFiles.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
              bVar14 = cmHasLiteralPrefix<13ul>(str_02,(char (*) [13])"Experimental"), !bVar14 ||
              (bVar14 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&listFiles,"Experimental"), !bVar14)))) {
LAB_00298aec:
            AppendTarget(this,&xml,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &listFiles,(cmGeneratorTarget *)0x0,psVar21,pcVar6,&compiler,psVar18);
          }
        }
        else if (TVar17 == GLOBAL_TARGET) {
          psVar23 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar6);
          __rhs = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(pcVar6);
          _Var15 = std::operator==(psVar23,__rhs);
          if (_Var15) goto LAB_00298aec;
        }
        std::__cxx11::string::~string((string *)&listFiles);
      }
    }
    cmXMLWriter::EndElement(&xml);
    allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &allFiles._M_t._M_impl.super__Rb_tree_header._M_header;
    allFiles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         allFiles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    allFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    cFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppcVar5 = (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    pcVar9 = ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->CMakeInstance;
    allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (ppcVar22 = (lgs->
                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        pbVar12 = cFiles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish, ppcVar22 != ppcVar5;
        ppcVar22 = ppcVar22 + 1) {
      pcVar6 = *ppcVar22;
      pcVar4 = pcVar6->Makefile;
      puVar28 = (pcVar6->GeneratorTargets).
                super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar7 = (pcVar6->GeneratorTargets).
               super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      while( true ) {
        if (puVar28 == puVar7) break;
        TVar17 = cmGeneratorTarget::GetType
                           ((puVar28->_M_t).
                            super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                            .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
        if (TVar17 < GLOBAL_TARGET) {
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pcVar8 = (puVar28->_M_t).
                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                   .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&lang,"CMAKE_BUILD_TYPE",(allocator<char> *)&listFiles);
          psVar21 = cmMakefile::GetSafeDefinition(pcVar4,&lang);
          cmGeneratorTarget::GetSourceFiles(pcVar8,&sources,psVar21);
          std::__cxx11::string::~string((string *)&lang);
          ppcVar13 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          for (ppcVar27 = sources.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start; ppcVar27 != ppcVar13;
              ppcVar27 = ppcVar27 + 1) {
            this_00 = *ppcVar27;
            TVar17 = cmGeneratorTarget::GetType
                               ((puVar28->_M_t).
                                super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                                .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
            if ((TVar17 != UTILITY) ||
               (bVar14 = cmSourceFile::GetIsGenerated(this_00,GlobalAndLocal), !bVar14)) {
              psVar21 = cmSourceFile::GetOrDetermineLanguage_abi_cxx11_(this_00);
              std::__cxx11::string::string((string *)&lang,(string *)psVar21);
              bVar14 = std::operator==(&lang,"C");
              if ((bVar14) ||
                 (((bVar14 = std::operator==(&lang,"CXX"), bVar14 ||
                   (bVar14 = std::operator==(&lang,"CUDA"), bVar14)) ||
                  (bVar14 = std::operator==(&lang,"HIP"), bVar14)))) {
                psVar21 = cmSourceFile::GetExtension_abi_cxx11_(this_00);
                ext._M_str = (psVar21->_M_dataplus)._M_p;
                ext._M_len = psVar21->_M_string_length;
                bVar14 = cmake::FileExtensions::Test(&pcVar9->CLikeSourceFileExtensions,ext);
              }
              else {
                bVar14 = false;
              }
              psVar21 = cmSourceFile::ResolveFullPath(this_00,(string *)0x0,(string *)0x0);
              psVar18 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(pcVar6);
              cmSystemTools::RelativePath((string *)&listFiles,psVar18,psVar21);
              this_01 = pcVar6->Makefile;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&fastTarget,"CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES",
                         (allocator<char> *)&local_320);
              bVar16 = cmMakefile::IsOn(this_01,&fastTarget);
              std::__cxx11::string::~string((string *)&fastTarget);
              if ((!bVar16) ||
                 (lVar19 = std::__cxx11::string::find((char *)&listFiles,0x5a5197), lVar19 == -1)) {
                if (bVar14 != false) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&cFiles,psVar21);
                }
                this_02 = (vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>
                           *)std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                             ::operator[](&allFiles,psVar21);
                fastTarget._M_dataplus._M_p =
                     (pointer)(puVar28->_M_t).
                              super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                              .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
                std::vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>::
                emplace_back<cmGeneratorTarget_const*>(this_02,(cmGeneratorTarget **)&fastTarget);
              }
              std::__cxx11::string::~string((string *)&listFiles);
              std::__cxx11::string::~string((string *)&lang);
            }
          }
          std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
                    (&sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
        }
        puVar28 = puVar28 + 1;
      }
    }
    pcVar9 = ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->CMakeInstance;
    for (filename_00 = cFiles.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; filename_00 != pbVar12;
        filename_00 = filename_00 + 1) {
      cmsys::SystemTools::GetFilenamePath((string *)&sources,filename_00);
      lang._M_dataplus._M_p =
           (pointer)sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
      lang._M_string_length =
           (size_type)
           sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      listFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
      listFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)&listFiles.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      listFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT71(listFiles.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,0x2f);
      cmsys::SystemTools::GetFilenameWithoutExtension(&local_320,filename_00);
      cmStrCat<std::__cxx11::string>
                (&fastTarget,(cmAlphaNum *)&lang,(cmAlphaNum *)&listFiles,&local_320);
      std::__cxx11::string::~string((string *)&local_320);
      std::__cxx11::string::~string((string *)&sources);
      pbVar10 = (pcVar9->HeaderFileExtensions).ordered.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (args = (pcVar9->HeaderFileExtensions).ordered.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; args != pbVar10; args = args + 1) {
        lang._M_dataplus._M_p = (pointer)fastTarget._M_string_length;
        lang._M_string_length = (size_type)fastTarget._M_dataplus._M_p;
        listFiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
        listFiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)&listFiles.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        listFiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)CONCAT71(listFiles.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,0x2e);
        cmStrCat<std::__cxx11::string>
                  ((string *)&sources,(cmAlphaNum *)&lang,(cmAlphaNum *)&listFiles,args);
        iVar24 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                 ::find(&allFiles._M_t,(string *)&sources);
        if ((_Rb_tree_header *)iVar24._M_node != &allFiles._M_t._M_impl.super__Rb_tree_header) {
LAB_00298fe1:
          std::__cxx11::string::~string((string *)&sources);
          break;
        }
        bVar14 = cmsys::SystemTools::FileExists((string *)&sources);
        if (bVar14) {
          __x = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                              *)&allFiles._M_t,filename_00);
          this_03 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                  *)&allFiles._M_t,(string *)&sources);
          std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
          operator=(&this_03->Targets,&__x->Targets);
          goto LAB_00298fe1;
        }
        std::__cxx11::string::~string((string *)&sources);
      }
      std::__cxx11::string::~string((string *)&fastTarget);
    }
    for (p_Var25 = allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var25 != &allFiles._M_t._M_impl.super__Rb_tree_header;
        p_Var25 = (_Base_ptr)std::_Rb_tree_increment(p_Var25)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&lang,"Unit",(allocator<char> *)&listFiles);
      cmXMLWriter::StartElement(&xml,&lang);
      std::__cxx11::string::~string((string *)&lang);
      cmXMLWriter::Attribute<std::__cxx11::string>
                (&xml,"filename",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var25 + 1))
      ;
      p_Var11 = p_Var25[2]._M_parent;
      for (p_Var26 = *(_Base_ptr *)(p_Var25 + 2); p_Var26 != p_Var11;
          p_Var26 = (_Base_ptr)&p_Var26->_M_parent) {
        pcVar8 = *(cmGeneratorTarget **)p_Var26;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&lang,"Option",(allocator<char> *)&listFiles);
        cmXMLWriter::StartElement(&xml,&lang);
        std::__cxx11::string::~string((string *)&lang);
        psVar21 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar8);
        cmXMLWriter::Attribute<std::__cxx11::string>(&xml,"target",psVar21);
        cmXMLWriter::EndElement(&xml);
      }
      cmXMLWriter::EndElement(&xml);
    }
    psVar21 = cmMakefile::GetHomeDirectory_abi_cxx11_(mf);
    std::operator+(&lang,psVar21,"/");
    Tree::BuildUnit(&tree,&xml,&lang);
    std::__cxx11::string::~string((string *)&lang);
    cmXMLWriter::EndElement(&xml);
    cmXMLWriter::EndElement(&xml);
    cmXMLWriter::EndDocument(&xml);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cFiles);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
    ::~_Rb_tree(&allFiles._M_t);
    cmXMLWriter::~cmXMLWriter(&xml);
    std::__cxx11::string::~string((string *)&compiler);
    Tree::~Tree(&tree);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator::CreateNewProjectFile(
  const std::vector<cmLocalGenerator*>& lgs, const std::string& filename)
{
  const cmMakefile* mf = lgs[0]->GetMakefile();
  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  Tree tree;

  // build tree of virtual folders
  for (auto const& it : this->GlobalGenerator->GetProjectMap()) {
    // Collect all files
    std::vector<std::string> listFiles;
    for (cmLocalGenerator* lg : it.second) {
      cm::append(listFiles, lg->GetMakefile()->GetListFiles());
    }

    // Convert
    for (std::string const& listFile : listFiles) {
      // don't put cmake's own files into the project (#12110):
      if (cmHasPrefix(listFile, cmSystemTools::GetCMakeRoot())) {
        continue;
      }

      const std::string& relative = cmSystemTools::RelativePath(
        it.second[0]->GetSourceDirectory(), listFile);
      std::vector<std::string> split;
      cmSystemTools::SplitPath(relative, split, false);
      // Split filename from path
      std::string fileName = *(split.end() - 1);
      split.erase(split.end() - 1, split.end());

      // We don't want paths with CMakeFiles in them
      // or do we?
      // In speedcrunch those where purely internal
      //
      // Also we can disable external (outside the project) files by setting ON
      // CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES variable.
      const bool excludeExternal = it.second[0]->GetMakefile()->IsOn(
        "CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES");
      if (!split.empty() &&
          (!excludeExternal || (relative.find("..") == std::string::npos)) &&
          relative.find("CMakeFiles") == std::string::npos) {
        tree.InsertPath(split, 1, fileName);
      }
    }
  }

  // figure out the compiler
  std::string compiler = this->GetCBCompilerId(mf);
  const std::string& make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  const std::string& makeArgs =
    mf->GetSafeDefinition("CMAKE_CODEBLOCKS_MAKE_ARGUMENTS");

  cmXMLWriter xml(fout);
  xml.StartDocument();
  xml.StartElement("CodeBlocks_project_file");

  xml.StartElement("FileVersion");
  xml.Attribute("major", 1);
  xml.Attribute("minor", 6);
  xml.EndElement();

  xml.StartElement("Project");

  xml.StartElement("Option");
  xml.Attribute("title", lgs[0]->GetProjectName());
  xml.EndElement();

  xml.StartElement("Option");
  xml.Attribute("makefile_is_custom", 1);
  xml.EndElement();

  xml.StartElement("Option");
  xml.Attribute("compiler", compiler);
  xml.EndElement();

  // Now build a virtual tree
  tree.BuildVirtualFolder(xml);

  xml.StartElement("Build");

  this->AppendTarget(xml, "all", nullptr, make, lgs[0], compiler, makeArgs);

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (cmLocalGenerator* lg : lgs) {
    const auto& targets = lg->GetGeneratorTargets();
    for (const auto& target : targets) {
      std::string targetName = target->GetName();
      switch (target->GetType()) {
        case cmStateEnums::GLOBAL_TARGET: {
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (lg->GetCurrentBinaryDirectory() == lg->GetBinaryDirectory()) {
            this->AppendTarget(xml, targetName, nullptr, make, lg, compiler,
                               makeArgs);
          }
        } break;
        case cmStateEnums::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if ((cmHasLiteralPrefix(targetName, "Nightly") &&
               (targetName != "Nightly")) ||
              (cmHasLiteralPrefix(targetName, "Continuous") &&
               (targetName != "Continuous")) ||
              (cmHasLiteralPrefix(targetName, "Experimental") &&
               (targetName != "Experimental"))) {
            break;
          }

          this->AppendTarget(xml, targetName, nullptr, make, lg, compiler,
                             makeArgs);
          break;
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          cmGeneratorTarget* gt = target.get();
          this->AppendTarget(xml, targetName, gt, make, lg, compiler,
                             makeArgs);
          std::string fastTarget = cmStrCat(targetName, "/fast");
          this->AppendTarget(xml, fastTarget, gt, make, lg, compiler,
                             makeArgs);
        } break;
        default:
          break;
      }
    }
  }

  xml.EndElement(); // Build

  // Collect all used source files in the project.
  // Keep a list of C/C++ source files which might have an accompanying header
  // that should be looked for.
  using all_files_map_t = std::map<std::string, CbpUnit>;
  all_files_map_t allFiles;
  std::vector<std::string> cFiles;

  auto* cm = this->GlobalGenerator->GetCMakeInstance();

  for (cmLocalGenerator* lg : lgs) {
    cmMakefile* makefile = lg->GetMakefile();
    const auto& targets = lg->GetGeneratorTargets();
    for (const auto& target : targets) {
      switch (target->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY:
        case cmStateEnums::UTILITY: // can have sources since 2.6.3
        {
          std::vector<cmSourceFile*> sources;
          target->GetSourceFiles(
            sources, makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for (cmSourceFile* s : sources) {
            // don't add source files from UTILITY target which have the
            // GENERATED property set:
            if (target->GetType() == cmStateEnums::UTILITY &&
                s->GetIsGenerated()) {
              continue;
            }

            // check whether it is a C/C++/CUDA/HIP implementation file
            bool isCFile = false;
            std::string lang = s->GetOrDetermineLanguage();
            if (lang == "C" || lang == "CXX" || lang == "CUDA" ||
                lang == "HIP") {
              std::string const& srcext = s->GetExtension();
              isCFile = cm->IsACLikeSourceExtension(srcext);
            }

            std::string const& fullPath = s->ResolveFullPath();

            // Check file position relative to project root dir.
            const std::string relative =
              cmSystemTools::RelativePath(lg->GetSourceDirectory(), fullPath);
            // Do not add this file if it has ".." in relative path and
            // if CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES variable is on.
            const bool excludeExternal = lg->GetMakefile()->IsOn(
              "CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES");
            if (excludeExternal &&
                (relative.find("..") != std::string::npos)) {
              continue;
            }

            if (isCFile) {
              cFiles.push_back(fullPath);
            }

            CbpUnit& cbpUnit = allFiles[fullPath];
            cbpUnit.Targets.push_back(target.get());
          }
        } break;
        default:
          break;
      }
    }
  }

  std::vector<std::string> const& headerExts =
    this->GlobalGenerator->GetCMakeInstance()->GetHeaderExtensions();

  // The following loop tries to add header files matching to implementation
  // files to the project. It does that by iterating over all
  // C/C++ source files,
  // replacing the file name extension with ".h" and checks whether such a
  // file exists. If it does, it is inserted into the map of files.
  // A very similar version of that code exists also in the CodeLite
  // project generator.
  for (std::string const& fileName : cFiles) {
    std::string headerBasename =
      cmStrCat(cmSystemTools::GetFilenamePath(fileName), '/',
               cmSystemTools::GetFilenameWithoutExtension(fileName));

    // check if there's a matching header around
    for (std::string const& ext : headerExts) {
      std::string hname = cmStrCat(headerBasename, '.', ext);
      // if it's already in the set, don't check if it exists on disk
      if (allFiles.find(hname) != allFiles.end()) {
        break;
      }

      if (cmSystemTools::FileExists(hname)) {
        allFiles[hname].Targets = allFiles[fileName].Targets;
        break;
      }
    }
  }

  // insert all source files in the CodeBlocks project
  for (auto const& s : allFiles) {
    std::string const& unitFilename = s.first;
    CbpUnit const& unit = s.second;

    xml.StartElement("Unit");
    xml.Attribute("filename", unitFilename);

    for (cmGeneratorTarget const* tgt : unit.Targets) {
      xml.StartElement("Option");
      xml.Attribute("target", tgt->GetName());
      xml.EndElement();
    }

    xml.EndElement();
  }

  // Add CMakeLists.txt
  tree.BuildUnit(xml, mf->GetHomeDirectory() + "/");

  xml.EndElement(); // Project
  xml.EndElement(); // CodeBlocks_project_file
  xml.EndDocument();
}